

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STParsedJSON.cpp
# Opt level: O3

optional<jbcoin::detail::STVar> *
jbcoin::STParsedJSONDetail::parseLeaf
          (optional<jbcoin::detail::STVar> *__return_storage_ptr__,string *json_name,
          string *fieldName,SField *name,Value *value,Value *error)

{
  char cVar1;
  ushort uVar2;
  pointer pcVar3;
  long *plVar4;
  ValueHolder VVar5;
  bool bVar6;
  uchar uVar7;
  unsigned_short uVar8;
  TxType TVar9;
  UInt UVar10;
  UInt UVar11;
  Int IVar12;
  LedgerEntryType LVar13;
  SField *name_00;
  ostream *poVar14;
  Value *this;
  Value *this_00;
  ValueHolder *extraout_RAX;
  ValueHolder *extraout_RAX_00;
  ValueHolder *pVVar15;
  undefined8 uVar16;
  optional<jbcoin::detail::STVar> *extraout_RAX_01;
  Value *pVVar17;
  optional<jbcoin::detail::STVar> *extraout_RAX_02;
  undefined8 *puVar18;
  optional<jbcoin::TER> oVar19;
  optional<jbcoin::detail::STVar> *extraout_RAX_03;
  optional<jbcoin::detail::STVar> *extraout_RAX_04;
  optional<jbcoin::detail::STVar> *extraout_RAX_05;
  optional<jbcoin::detail::STVar> *extraout_RAX_06;
  optional<jbcoin::detail::STVar> *extraout_RAX_07;
  optional<jbcoin::detail::STVar> *extraout_RAX_08;
  optional<jbcoin::detail::STVar> *extraout_RAX_09;
  optional<jbcoin::detail::STVar> *poVar20;
  optional<jbcoin::detail::STVar> *extraout_RAX_10;
  optional<jbcoin::detail::STVar> *extraout_RAX_11;
  optional<jbcoin::detail::STVar> *extraout_RAX_12;
  optional<jbcoin::detail::STVar> *extraout_RAX_13;
  optional<jbcoin::detail::STVar> *extraout_RAX_14;
  optional<jbcoin::detail::STVar> *extraout_RAX_15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX_16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  uint *args_1;
  string *s;
  string *s_00;
  string *s_01;
  byte bVar22;
  uint uVar23;
  byte bVar24;
  char *pcVar25;
  ValueHolder VVar26;
  char *pcVar27;
  _Alloc_hider _Var28;
  base_uint<256UL,_void> *__n;
  bool hasCurrency;
  string element_name;
  string strValue;
  STVar st;
  STPath p;
  Value pathEl;
  AccountID uIssuer;
  AccountID uAccount;
  Currency uCurrency;
  ValueHolder local_3c8;
  ushort local_3c0;
  undefined6 uStack_3be;
  ValueHolder local_3b8 [2];
  bool local_3a1;
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_390;
  ulong local_380;
  undefined1 local_378 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_368;
  undefined1 local_358 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_348;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_338;
  uint32_t local_328 [6];
  ios_base *local_310;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [64];
  rval_reference_type local_2a8;
  ios_base aiStack_278 [272];
  value_type local_168;
  Value local_148;
  base_uint<160UL,_jbcoin::detail::AccountIDTag> local_138;
  base_uint<160UL,_jbcoin::detail::AccountIDTag> local_118;
  base_uint<160UL,_jbcoin::detail::CurrencyTag> local_f8;
  ulong local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  (__return_storage_ptr__->super_type).m_initialized = false;
  name_00 = SField::getField(fieldName);
  if (name_00->fieldCode == sfInvalid) {
    unknown_field((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
LAB_001cb40d:
    VVar26 = value->value_;
    (value->value_).string_ = (char *)local_2f8._0_8_;
    uVar2 = *(ushort *)&value->field_0x8;
    *(ushort *)&value->field_0x8 = local_2f8._8_2_ & 0x1ff | uVar2 & 0xfe00;
    local_2f8._8_2_ = uVar2 & 0x1ff | local_2f8._8_2_ & 0xfe00;
    local_2f8._0_8_ = VVar26;
    goto LAB_001ccac2;
  }
  args_1 = &switchD_001cb477::switchdataD_00275440;
  switch(name_00->fieldType) {
  case STI_UINT16:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      uVar23 = Json::Value::asInt((Value *)name);
      if (0xffff < uVar23) {
        Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Value out of range");
      }
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d5620;
      local_2e8._0_2_ = (short)uVar23;
      local_2f8._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      poVar20 = extraout_RAX_07;
      goto LAB_001cc17b;
    }
    if (cVar1 == '\x02') {
      UVar10 = Json::Value::asUInt((Value *)name);
      if (0xffff < UVar10) {
        Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Value out of range");
      }
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d5620;
      local_2e8._0_2_ = (short)UVar10;
      local_2f8._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      poVar20 = extraout_RAX_05;
      goto LAB_001cc17b;
    }
    if (cVar1 != '\x04') {
      bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
      break;
    }
    Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
    if (((SField *)local_358._8_8_ == (SField *)0x0) ||
       (0xf5 < (byte)(*(char *)local_358._0_8_ - 0x3aU))) {
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_358._0_8_,
                 (char *)(local_358._0_8_ + (long)(int *)local_358._8_8_));
      uVar8 = beast::lexicalCastThrow<unsigned_short,std::__cxx11::string>(&local_d0);
      local_2f8._0_8_ = &PTR__STBase_002d5620;
      local_2e8._0_2_ = uVar8;
      local_2f8._8_8_ = name_00;
      local_2a8 = (rval_reference_type)local_2f8;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar18 = *(undefined8 **)&local_2a8->d_;
LAB_001ccd80:
        (*(code *)*puVar18)();
      }
      else if (local_2a8 != (rval_reference_type)0x0) {
        puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
        goto LAB_001ccd80;
      }
      local_2a8 = (rval_reference_type)0x0;
      local_70.field_2._M_allocated_capacity = local_d0.field_2._M_allocated_capacity;
      _Var28._M_p = local_d0._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_001ccdd3;
    }
    else {
      if (name_00->fieldCode == sfTransactionType) {
        TxFormats::getInstance();
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_358._0_8_,
                   (char *)(local_358._0_8_ + (long)(int *)local_358._8_8_));
        TVar9 = KnownFormats<jbcoin::TxType>::findTypeByName
                          (&TxFormats::getInstance::instance.super_KnownFormats<jbcoin::TxType>,
                           &local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        local_2a8 = (rval_reference_type)local_2f8;
        local_2f8._0_8_ = &PTR__STBase_002d5620;
        local_2e8._0_2_ = (short)TVar9;
        local_2f8._8_8_ = name_00;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,local_2a8);
      }
      else {
        if (name_00->fieldCode != sfLedgerEntryType) {
          invalid_data((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
          goto LAB_001ccf7c;
        }
        LedgerFormats::getInstance();
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_358._0_8_,
                   (char *)(local_358._0_8_ + (long)(int *)local_358._8_8_));
        LVar13 = KnownFormats<jbcoin::LedgerEntryType>::findTypeByName
                           (&LedgerFormats::getInstance::instance.
                             super_KnownFormats<jbcoin::LedgerEntryType>,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        local_2a8 = (rval_reference_type)local_2f8;
        local_2f8._0_8_ = &PTR__STBase_002d5620;
        local_2e8._0_2_ = (short)LVar13;
        local_2f8._8_8_ = name_00;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,local_2a8);
      }
LAB_001cce7c:
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar18 = *(undefined8 **)&local_2a8->d_;
      }
      else {
        if (local_2a8 == (rval_reference_type)0x0) goto LAB_001ccebf;
        puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
      }
      (*(code *)*puVar18)();
    }
LAB_001ccebf:
    bVar24 = 1;
    bVar22 = 0;
    goto LAB_001ccec4;
  case STI_UINT32:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      IVar12 = Json::Value::asInt((Value *)name);
      if (IVar12 < 0) {
        Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Value out of range");
      }
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d56a0;
      local_2e8._0_4_ = IVar12;
      local_2f8._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      poVar20 = extraout_RAX_08;
      goto LAB_001cc17b;
    }
    if (cVar1 == '\x02') {
      UVar10 = Json::Value::asUInt((Value *)name);
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d56a0;
      local_2e8._0_4_ = UVar10;
      local_2f8._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      poVar20 = extraout_RAX_06;
      goto LAB_001cc17b;
    }
    if (cVar1 != '\x04') {
      bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
      break;
    }
    Json::Value::asString_abi_cxx11_(&local_50,(Value *)name);
    local_2e8._0_4_ = beast::lexicalCastThrow<unsigned_int,std::__cxx11::string>(&local_50);
    local_2f8._0_8_ = &PTR__STBase_002d56a0;
    local_2f8._8_8_ = name_00;
    local_2a8 = (rval_reference_type)local_2f8;
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
    if (local_2a8 == (rval_reference_type)local_2f8) {
      puVar18 = *(undefined8 **)&local_2a8->d_;
LAB_001ccd13:
      (*(code *)*puVar18)();
    }
    else if (local_2a8 != (rval_reference_type)0x0) {
      puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
      goto LAB_001ccd13;
    }
    uVar16 = local_50._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p == &local_50.field_2) {
      return (optional<jbcoin::detail::STVar> *)&local_50.field_2;
    }
LAB_001cc726:
    local_2a8 = (rval_reference_type)0x0;
    pcVar25 = (char *)(local_50.field_2._M_allocated_capacity + 1);
LAB_001ccbb1:
    operator_delete((void *)uVar16,(ulong)pcVar25);
    return extraout_RAX_12;
  case STI_UINT64:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      uVar23 = Json::Value::asInt((Value *)name);
      if ((int)uVar23 < 0) {
        Throw<std::runtime_error,char_const(&)[19]>((char (*) [19])"Value out of range");
      }
      local_2e8._0_8_ = ZEXT48(uVar23);
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d5708;
      local_2f8._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      poVar20 = extraout_RAX_04;
      goto LAB_001cc17b;
    }
    if (cVar1 == '\x02') {
      UVar10 = Json::Value::asUInt((Value *)name);
      local_2e8._0_8_ = ZEXT48(UVar10);
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d5708;
      local_2f8._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      poVar20 = extraout_RAX_03;
      goto LAB_001cc17b;
    }
    if (cVar1 == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
      local_2e8._0_8_ = uintFromHex((string *)local_358);
      local_2a8 = (rval_reference_type)local_2f8;
      local_2f8._0_8_ = &PTR__STBase_002d5708;
      local_2f8._8_8_ = name_00;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,local_2a8);
      goto LAB_001cc5f3;
    }
    bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    break;
  case STI_HASH128:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
      detail::make_stvar<jbcoin::STBitString<128ul>,jbcoin::SField_const&,std::__cxx11::string>
                ((STVar *)local_2f8,(detail *)name_00,(SField *)local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
LAB_001cc5f3:
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar18 = *(undefined8 **)&local_2a8->d_;
LAB_001cc6fb:
        (*(code *)*puVar18)();
      }
      else if (local_2a8 != (rval_reference_type)0x0) {
        puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
        goto LAB_001cc6fb;
      }
      local_50.field_2._M_allocated_capacity = aStack_348._M_allocated_capacity;
      uVar16 = local_358._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._0_8_ == &aStack_348) {
        return (optional<jbcoin::detail::STVar> *)&aStack_348;
      }
      goto LAB_001cc726;
    }
    bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    break;
  case STI_HASH256:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
      detail::make_stvar<jbcoin::STBitString<256ul>,jbcoin::SField_const&,std::__cxx11::string>
                ((STVar *)local_2f8,(detail *)name_00,(SField *)local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      goto LAB_001cc5f3;
    }
    bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    break;
  case STI_AMOUNT:
    amountFromJson((STAmount *)local_358,name_00,(Value *)name);
    local_2a8 = (rval_reference_type)local_2f8;
    local_2f8._8_8_ = local_358._8_8_;
    local_2f8._0_8_ = &PTR__STBase_002d2fc0;
    local_2e8._0_8_ = aStack_348._M_allocated_capacity;
    local_2e8._8_8_ = aStack_348._8_8_;
    local_2e8._16_8_ = aStack_338._M_allocated_capacity;
    local_2e8._24_8_ = aStack_338._8_8_;
    local_2e8._32_4_ = local_328[0];
    local_2e8._36_4_ = local_328[1];
    boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
              (&__return_storage_ptr__->super_type,local_2a8);
    poVar20 = extraout_RAX_01;
LAB_001cc17b:
    if (local_2a8 == (rval_reference_type)local_2f8) {
      puVar18 = *(undefined8 **)&local_2a8->d_;
    }
    else {
      if (local_2a8 == (rval_reference_type)0x0) {
        return poVar20;
      }
      puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
    }
    poVar20 = (optional<jbcoin::detail::STVar> *)(*(code *)*puVar18)();
    return poVar20;
  case STI_VL:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_2f8,(Value *)name);
      strUnHex((pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_bool> *)local_358,
               (string *)local_2f8);
      if ((undefined1 *)local_2f8._0_8_ != local_2e8) {
        operator_delete((void *)local_2f8._0_8_,local_2e8._0_8_ + 1);
      }
      uVar16 = local_358._0_8_;
      if (aStack_348._M_local_buf[8] == '\0') {
        Throw<std::invalid_argument,char_const(&)[13]>((char (*) [13])"invalid data");
      }
      local_2f8._0_8_ = &PTR__STBlob_002d30a8;
      __n = (base_uint<256UL,_void> *)(local_358._8_8_ - local_358._0_8_);
      if (__n == (base_uint<256UL,_void> *)0x0) {
        local_2e8._0_8_ = (void *)0x0;
        local_2e8._8_8_ = (base_uint<256UL,_void> *)0x0;
        local_2f8._8_8_ = name_00;
      }
      else {
        local_2f8._8_8_ = name_00;
        local_2e8._0_8_ = operator_new__((ulong)__n);
        local_2e8._8_8_ = __n;
        memcpy((void *)local_2e8._0_8_,(void *)uVar16,(size_t)__n);
      }
      local_2a8 = (rval_reference_type)local_2f8;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar18 = *(undefined8 **)&local_2a8->d_;
LAB_001ccb98:
        poVar20 = (optional<jbcoin::detail::STVar> *)(*(code *)*puVar18)();
      }
      else {
        poVar20 = extraout_RAX_11;
        if (local_2a8 != (rval_reference_type)0x0) {
          puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
          goto LAB_001ccb98;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)uVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return poVar20;
      }
      pcVar25 = (char *)(aStack_348._M_allocated_capacity - uVar16);
      goto LAB_001ccbb1;
    }
    bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    break;
  case STI_ACCOUNT:
    if ((char)name->fieldValue != '\x04') {
      bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
      break;
    }
    Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
    parseHexOrBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
              ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)local_3a0,
               (jbcoin *)local_358,s_01);
    bVar24 = local_3a0[0];
    if (local_3a0[0] == false) {
      invalid_data((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
      Json::Value::swap(value,(Value *)local_2f8);
      Json::Value::~Value((Value *)local_2f8);
    }
    else {
      local_2f8._0_8_ = &PTR__STBase_002d2ef0;
      local_2e8._0_8_ = CONCAT44(local_3a0._8_4_,local_3a0._4_4_);
      local_2e8._16_8_ =
           CONCAT44(SUB84(local_2e8._16_8_,4),aStack_390._M_allocated_capacity._4_4_) &
           0xffffff00ffffffff;
      local_2f8._8_8_ = name_00;
      local_2a8 = (rval_reference_type)local_2f8;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar18 = *(undefined8 **)&local_2a8->d_;
      }
      else {
        if (local_2a8 == (rval_reference_type)0x0) goto LAB_001ccd06;
        puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
      }
      (*(code *)*puVar18)();
    }
LAB_001ccd06:
    bVar22 = bVar24 ^ 1;
LAB_001ccec4:
    paVar21 = &aStack_348;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._0_8_ != paVar21) {
      operator_delete((void *)local_358._0_8_,(ulong)(aStack_348._M_allocated_capacity + 1));
      paVar21 = extraout_RAX_16;
    }
    if (bVar24 != 0) {
      return (optional<jbcoin::detail::STVar> *)paVar21;
    }
    if (bVar22 != 0) {
      return (optional<jbcoin::detail::STVar> *)paVar21;
    }
LAB_001ccef6:
    if ((__return_storage_ptr__->super_type).m_initialized != true) {
      return __return_storage_ptr__;
    }
    plVar4 = *(long **)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x50);
    if ((storage_type *)plVar4 == &(__return_storage_ptr__->super_type).m_storage) {
      puVar18 = (undefined8 *)*plVar4;
    }
    else {
      if (plVar4 == (long *)0x0) goto LAB_001ccf29;
      puVar18 = (undefined8 *)(*plVar4 + 8);
    }
    (*(code *)*puVar18)();
LAB_001ccf29:
    *(undefined8 *)((long)&(__return_storage_ptr__->super_type).m_storage.dummy_ + 0x50) = 0;
    (__return_storage_ptr__->super_type).m_initialized = false;
    return __return_storage_ptr__;
  default:
    bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    goto LAB_001cb40d;
  case STI_UINT8:
    cVar1 = (char)name->fieldValue;
    if (cVar1 == '\x01') {
      IVar12 = Json::Value::asInt((Value *)name);
      if ((-1 < IVar12) && (IVar12 = Json::Value::asInt((Value *)name), IVar12 < 0x100)) {
        IVar12 = Json::Value::asInt((Value *)name);
        local_2a8 = (rval_reference_type)local_2f8;
        local_2f8._0_8_ = &PTR__STBase_002d55a0;
        local_2e8[0] = (char)IVar12;
        local_2f8._8_8_ = name_00;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,local_2a8);
        poVar20 = extraout_RAX_15;
        goto LAB_001cc17b;
      }
      out_of_range((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    }
    else if (cVar1 == '\x02') {
      UVar10 = Json::Value::asUInt((Value *)name);
      if (UVar10 < 0x100) {
        UVar10 = Json::Value::asUInt((Value *)name);
        local_2a8 = (rval_reference_type)local_2f8;
        local_2f8._0_8_ = &PTR__STBase_002d55a0;
        local_2e8[0] = (char)UVar10;
        local_2f8._8_8_ = name_00;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,local_2a8);
        poVar20 = extraout_RAX_14;
        goto LAB_001cc17b;
      }
      out_of_range((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    }
    else {
      if (cVar1 == '\x04') {
        Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
        if (((SField *)local_358._8_8_ != (SField *)0x0) &&
           ((byte)(*(char *)local_358._0_8_ - 0x3aU) < 0xf6)) {
          if (name_00->fieldCode == sfTransactionResult) {
            oVar19 = transCode((jbcoin *)local_358,(string *)local_358._0_8_);
            if (((ulong)oVar19.super_type >> 0x28 == 0 & oVar19.super_type.m_initialized) != 0) {
              local_2a8 = (rval_reference_type)local_2f8;
              local_2f8._0_8_ = &PTR__STBase_002d55a0;
              local_2e8[0] = (char)oVar19.super_type.m_storage;
              local_2f8._8_8_ = name_00;
              boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                        (&__return_storage_ptr__->super_type,local_2a8);
              goto LAB_001cce7c;
            }
            out_of_range((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
          }
          else {
            bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
          }
LAB_001ccf7c:
          Json::Value::swap(value,(Value *)local_2f8);
          Json::Value::~Value((Value *)local_2f8);
          bVar22 = 1;
          bVar24 = 0;
          goto LAB_001ccec4;
        }
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_358._0_8_,
                   (char *)(local_358._0_8_ + (long)(int *)local_358._8_8_));
        uVar7 = beast::lexicalCastThrow<unsigned_char,std::__cxx11::string>(&local_70);
        local_2f8._0_8_ = &PTR__STBase_002d55a0;
        local_2e8[0] = uVar7;
        local_2f8._8_8_ = name_00;
        local_2a8 = (rval_reference_type)local_2f8;
        boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                  (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
        if (local_2a8 == (rval_reference_type)local_2f8) {
          puVar18 = *(undefined8 **)&local_2a8->d_;
LAB_001ccdac:
          (*(code *)*puVar18)();
        }
        else if (local_2a8 != (rval_reference_type)0x0) {
          puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
          goto LAB_001ccdac;
        }
        local_2a8 = (rval_reference_type)0x0;
        _Var28._M_p = local_70._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_001ccebf;
LAB_001ccdd3:
        local_2a8 = (rval_reference_type)0x0;
        operator_delete(_Var28._M_p,local_70.field_2._M_allocated_capacity + 1);
        goto LAB_001ccebf;
      }
      bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    }
    break;
  case STI_HASH160:
    if ((char)name->fieldValue == '\x04') {
      Json::Value::asString_abi_cxx11_((string *)local_358,(Value *)name);
      detail::make_stvar<jbcoin::STBitString<160ul>,jbcoin::SField_const&,std::__cxx11::string>
                ((STVar *)local_2f8,(detail *)name_00,(SField *)local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      goto LAB_001cc5f3;
    }
    bad_type((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    break;
  case STI_PATHSET:
    cVar1 = (char)name->fieldValue;
    if ((cVar1 == '\0') || (cVar1 == '\x06')) {
      local_358._0_8_ = &PTR__STPathSet_002d3258;
      aStack_348._M_allocated_capacity = 0;
      aStack_348._8_8_ = (base_uint<256UL,_void> *)0x0;
      aStack_338._M_allocated_capacity = 0;
      local_358._8_8_ = name_00;
      UVar10 = Json::Value::size((Value *)name);
      if (UVar10 != 0) {
        local_310 = aiStack_278;
        local_380 = 0;
        uVar23 = 0;
        do {
          local_168.mPath.
          super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          local_168.mPath.
          super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          local_168.mPath.
          super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pVVar17 = Json::Value::operator[]((Value *)name,uVar23);
          if ((pVVar17->field_0x8 == '\x06') || (pVVar17->field_0x8 == '\0')) {
            local_d8 = (ulong)uVar23;
            UVar10 = 0;
            do {
              pVVar17 = Json::Value::operator[]((Value *)name,uVar23);
              UVar11 = Json::Value::size(pVVar17);
              if (UVar11 <= UVar10) {
                bVar6 = true;
                std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::push_back
                          ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&aStack_348,
                           &local_168);
                goto LAB_001cbfdb;
              }
              std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_2e8,(fieldName->_M_dataplus)._M_p,
                                   fieldName->_M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"[",1);
              poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"][",2);
              poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]",1);
              local_3c8.string_ = (char *)local_3b8;
              pcVar3 = (json_name->_M_dataplus)._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_3c8,pcVar3,pcVar3 + json_name->_M_string_length);
              std::__cxx11::string::append((char *)&local_3c8.int_);
              std::__cxx11::stringbuf::str();
              VVar26.real_ = 7.4109846876187e-323;
              if (local_3c8 != local_3b8) {
                VVar26 = local_3b8[0];
              }
              pcVar25 = (char *)(CONCAT44(local_378._12_4_,
                                          CONCAT22(local_378._10_2_,local_378._8_2_)) +
                                CONCAT62(uStack_3be,local_3c0));
              if (VVar26 < pcVar25) {
                pcVar27 = (char *)0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_378._4_4_,local_378._0_4_) != &aStack_368) {
                  pcVar27 = (char *)CONCAT44(aStack_368._M_allocated_capacity._4_4_,
                                             aStack_368._M_allocated_capacity._0_4_);
                }
                if (pcVar27 < pcVar25) goto LAB_001cb767;
                puVar18 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)local_378,0,(char *)0x0,(ulong)local_3c8);
              }
              else {
LAB_001cb767:
                puVar18 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_3c8.int_,
                                     CONCAT44(local_378._4_4_,local_378._0_4_));
              }
              local_3a0._0_8_ = &aStack_390;
              paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(puVar18 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar18 == paVar21) {
                aStack_390._8_8_ = puVar18[3];
                aStack_390._M_allocated_capacity._0_4_ = (undefined4)paVar21->_M_allocated_capacity;
                aStack_390._M_allocated_capacity._4_4_ =
                     (undefined4)(paVar21->_M_allocated_capacity >> 0x20);
              }
              else {
                aStack_390._M_allocated_capacity._0_4_ = (undefined4)paVar21->_M_allocated_capacity;
                aStack_390._M_allocated_capacity._4_4_ =
                     (undefined4)(paVar21->_M_allocated_capacity >> 0x20);
                local_3a0._0_8_ =
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*puVar18;
              }
              local_3a0._8_4_ = (undefined4)puVar18[1];
              local_3a0._12_4_ = (undefined4)((ulong)puVar18[1] >> 0x20);
              *puVar18 = paVar21;
              puVar18[1] = 0;
              paVar21->_M_local_buf[0] = '\0';
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_378._4_4_,local_378._0_4_) != &aStack_368) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(local_378._4_4_,local_378._0_4_),
                                CONCAT44(aStack_368._M_allocated_capacity._4_4_,
                                         aStack_368._M_allocated_capacity._0_4_) + 1);
              }
              if (local_3c8 != local_3b8) {
                operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
              }
              pVVar17 = Json::Value::operator[]((Value *)name,uVar23);
              pVVar17 = Json::Value::operator[](pVVar17,UVar10);
              Json::Value::Value(&local_148,pVVar17);
              if ((local_148._8_1_ == '\0') || (local_148._8_1_ == '\a')) {
                pVVar17 = Json::Value::resolveReference(&local_148,"account",false);
                this = Json::Value::resolveReference(&local_148,"currency",false);
                this_00 = Json::Value::resolveReference(&local_148,"issuer",false);
                local_3a1 = false;
                local_118.pn[4] = 0;
                local_118.pn[0] = 0;
                local_118.pn[1] = 0;
                local_118.pn[2] = 0;
                local_118.pn[3] = 0;
                local_138.pn[4] = 0;
                local_138.pn[0] = 0;
                local_138.pn[1] = 0;
                local_138.pn[2] = 0;
                local_138.pn[3] = 0;
                local_f8.pn[4] = 0;
                local_f8.pn[0] = 0;
                local_f8.pn[1] = 0;
                local_f8.pn[2] = 0;
                local_f8.pn[3] = 0;
                bVar6 = Json::Value::operator_cast_to_bool(pVVar17);
                if (!bVar6) goto LAB_001cb985;
                if (pVVar17->field_0x8 != '\x04') {
                  local_3c8.string_ = (char *)local_3b8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"account","")
                  ;
                  string_expected((string *)local_378,(string *)local_3a0._0_8_);
                  goto LAB_001cbd2c;
                }
                Json::Value::asString_abi_cxx11_((string *)&local_3c8,pVVar17);
                bVar6 = base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHexExact
                                  (&local_118,local_3c8.string_);
                if (local_3c8 != local_3b8) {
                  operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                }
                if (!bVar6) {
                  Json::Value::asString_abi_cxx11_((string *)&local_3c8,pVVar17);
                  parseBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
                            ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                             local_378,(jbcoin *)&local_3c8.bool_,s);
                  if (local_3c8 != local_3b8) {
                    operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                  }
                  if ((bool)local_378[0] != false) {
                    local_118.pn[4] = aStack_368._M_allocated_capacity._4_4_;
                    local_118.pn[1]._0_2_ = local_378._8_2_;
                    local_118.pn[0] = local_378._4_4_;
                    local_118.pn[1]._2_2_ = local_378._10_2_;
                    local_118.pn[3] = aStack_368._M_allocated_capacity._0_4_;
                    local_118.pn[2] = local_378._12_4_;
                    goto LAB_001cb985;
                  }
                  local_3c8.string_ = (char *)local_3b8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"account","")
                  ;
                  paVar21 = &local_308;
                  invalid_data((string *)paVar21,(string *)local_3a0._0_8_);
                  VVar26 = value->value_;
                  value->value_ = (ValueHolder)local_308._M_allocated_capacity;
                  uVar2 = *(ushort *)&value->field_0x8;
                  *(ushort *)&value->field_0x8 = local_308._8_2_ & 0x1ff | uVar2 & 0xfe00;
                  local_308._8_2_ = uVar2 & 0x1ff | local_308._8_2_ & 0xfe00;
                  local_308._M_allocated_capacity = (size_type)VVar26;
LAB_001cbd84:
                  Json::Value::~Value((Value *)paVar21);
                  pVVar15 = local_3b8;
                  if (local_3c8 != pVVar15) {
                    operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                    pVVar15 = extraout_RAX_00;
                  }
                  goto LAB_001cbda5;
                }
LAB_001cb985:
                bVar6 = Json::Value::operator_cast_to_bool(this);
                if (bVar6) {
                  if (this->field_0x8 == '\x04') {
                    local_3a1 = true;
                    Json::Value::asString_abi_cxx11_((string *)&local_3c8,this);
                    bVar6 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::SetHexExact
                                      (&local_f8,local_3c8.string_);
                    if (local_3c8 != local_3b8) {
                      operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                    }
                    if (!bVar6) {
                      Json::Value::asString_abi_cxx11_((string *)&local_3c8,this);
                      bVar6 = to_currency(&local_f8,(string *)&local_3c8);
                      if (local_3c8 != local_3b8) {
                        operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                      }
                      if (!bVar6) {
                        local_3c8.string_ = (char *)local_3b8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_3c8,"currency","");
                        invalid_data((string *)local_378,(string *)local_3a0._0_8_);
                        goto LAB_001cbd2c;
                      }
                    }
                    goto LAB_001cba31;
                  }
                  local_3c8.string_ = (char *)local_3b8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_3c8,"currency","");
                  string_expected((string *)local_378,(string *)local_3a0._0_8_);
LAB_001cbd2c:
                  VVar26 = value->value_;
                  paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_378;
                  VVar5._4_4_ = local_378._4_4_;
                  VVar5.int_ = local_378._0_4_;
                  value->value_ = VVar5;
                  local_378._0_4_ = VVar26.int_;
                  local_378._4_4_ = VVar26._4_4_;
                  uVar2 = *(ushort *)&value->field_0x8;
                  *(ushort *)&value->field_0x8 = local_378._8_2_ & 0x1ff | uVar2 & 0xfe00;
                  local_378._8_2_ = uVar2 & 0x1ff | local_378._8_2_ & 0xfe00;
                  goto LAB_001cbd84;
                }
LAB_001cba31:
                bVar6 = Json::Value::operator_cast_to_bool(this_00);
                if (bVar6) {
                  if (this_00->field_0x8 != '\x04') {
                    local_3c8.string_ = (char *)local_3b8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_3c8,"issuer","");
                    string_expected((string *)local_378,(string *)local_3a0._0_8_);
                    goto LAB_001cbd2c;
                  }
                  Json::Value::asString_abi_cxx11_((string *)&local_3c8,this_00);
                  bVar6 = base_uint<160UL,_jbcoin::detail::AccountIDTag>::SetHexExact
                                    (&local_138,local_3c8.string_);
                  if (local_3c8 != local_3b8) {
                    operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                  }
                  if (!bVar6) {
                    Json::Value::asString_abi_cxx11_((string *)&local_3c8,this_00);
                    parseBase58<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>>
                              ((optional<jbcoin::base_uint<160UL,_jbcoin::detail::AccountIDTag>_> *)
                               local_378,(jbcoin *)&local_3c8.bool_,s_00);
                    paVar21 = &local_308;
                    if (local_3c8 != local_3b8) {
                      operator_delete(local_3c8.string_,(ulong)(local_3b8[0].string_ + 1));
                    }
                    if ((bool)local_378[0] == false) {
                      local_3c8.string_ = (char *)local_3b8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_3c8,"issuer","");
                      invalid_data((string *)paVar21,(string *)local_3a0._0_8_);
                      VVar26 = value->value_;
                      value->value_ = (ValueHolder)local_308._M_allocated_capacity;
                      uVar2 = *(ushort *)&value->field_0x8;
                      *(ushort *)&value->field_0x8 = local_308._8_2_ & 0x1ff | uVar2 & 0xfe00;
                      local_308._8_2_ = uVar2 & 0x1ff | local_308._8_2_ & 0xfe00;
                      local_308._M_allocated_capacity = (size_type)VVar26;
                      goto LAB_001cbd84;
                    }
                    local_138.pn[4] = aStack_368._M_allocated_capacity._4_4_;
                    local_138.pn[1]._0_2_ = local_378._8_2_;
                    local_138.pn[0] = local_378._4_4_;
                    local_138.pn[1]._2_2_ = local_378._10_2_;
                    local_138.pn[3] = aStack_368._M_allocated_capacity._0_4_;
                    local_138.pn[2] = local_378._12_4_;
                  }
                }
                bVar6 = true;
                std::vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>>::
                emplace_back<jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,jbcoin::base_uint<160ul,jbcoin::detail::CurrencyTag>&,jbcoin::base_uint<160ul,jbcoin::detail::AccountIDTag>&,bool&>
                          ((vector<jbcoin::STPathElement,std::allocator<jbcoin::STPathElement>> *)
                           &local_168,&local_118,&local_f8,&local_138,&local_3a1);
              }
              else {
                not_an_object((STParsedJSONDetail *)&local_3c8.bool_,(string *)local_3a0);
                VVar26 = value->value_;
                value->value_ = local_3c8;
                uVar2 = *(ushort *)&value->field_0x8;
                *(ushort *)&value->field_0x8 = local_3c0 & 0x1ff | uVar2 & 0xfe00;
                local_3c0 = uVar2 & 0x1ff | local_3c0 & 0xfe00;
                local_3c8 = VVar26;
                Json::Value::~Value((Value *)&local_3c8);
                pVVar15 = extraout_RAX;
LAB_001cbda5:
                local_380 = CONCAT71((int7)((ulong)pVVar15 >> 8),1);
                bVar6 = false;
              }
              Json::Value::~Value(&local_148);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_3a0._0_8_ != &aStack_390) {
                operator_delete((void *)local_3a0._0_8_,
                                CONCAT44(aStack_390._M_allocated_capacity._4_4_,
                                         aStack_390._M_allocated_capacity._0_4_) + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_2f8);
              std::ios_base::~ios_base(local_310);
              UVar10 = UVar10 + 1;
            } while (bVar6);
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_2f8);
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_2e8,(fieldName->_M_dataplus)._M_p,
                                 fieldName->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"[",1);
            poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,"]",1);
            std::__cxx11::stringbuf::str();
            array_expected((string *)&local_3c8,(string *)(json_name->_M_dataplus)._M_p);
            VVar26 = value->value_;
            value->value_ = local_3c8;
            uVar2 = *(ushort *)&value->field_0x8;
            *(ushort *)&value->field_0x8 = local_3c0 & 0x1ff | uVar2 & 0xfe00;
            local_3c0 = uVar2 & 0x1ff | local_3c0 & 0xfe00;
            local_3c8 = VVar26;
            Json::Value::~Value((Value *)&local_3c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3a0._0_8_ != &aStack_390) {
              operator_delete((void *)local_3a0._0_8_,
                              CONCAT44(aStack_390._M_allocated_capacity._4_4_,
                                       aStack_390._M_allocated_capacity._0_4_) + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_2f8);
            uVar16 = std::ios_base::~ios_base(local_310);
            local_380 = CONCAT71((int7)((ulong)uVar16 >> 8),1);
          }
          bVar6 = false;
LAB_001cbfdb:
          if (local_168.mPath.
              super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_168.mPath.
                            super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_168.mPath.
                                  super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_168.mPath.
                                  super__Vector_base<jbcoin::STPathElement,_std::allocator<jbcoin::STPathElement>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (!bVar6) {
            std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::~vector
                      ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&aStack_348);
            if ((local_380 & 1) != 0) {
              return extraout_RAX_10;
            }
            goto LAB_001ccef6;
          }
          uVar23 = uVar23 + 1;
          UVar10 = Json::Value::size((Value *)name);
        } while (uVar23 < UVar10);
      }
      local_2f8._0_8_ = &PTR__STPathSet_002d3258;
      local_2f8._8_8_ = local_358._8_8_;
      local_2e8._0_8_ = aStack_348._M_allocated_capacity;
      local_2e8._8_8_ = aStack_348._8_8_;
      local_2e8._16_8_ = aStack_338._M_allocated_capacity;
      aStack_348._M_allocated_capacity = 0;
      aStack_348._8_8_ = 0;
      aStack_338._M_allocated_capacity = 0;
      local_2a8 = (rval_reference_type)local_2f8;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar18 = *(undefined8 **)&local_2a8->d_;
      }
      else {
        if (local_2a8 == (rval_reference_type)0x0) goto LAB_001cccb5;
        puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
      }
      (*(code *)*puVar18)();
LAB_001cccb5:
      std::vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_>::~vector
                ((vector<jbcoin::STPath,_std::allocator<jbcoin::STPath>_> *)&aStack_348);
      return extraout_RAX_13;
    }
    array_expected((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
    break;
  case STI_VECTOR256:
    cVar1 = (char)name->fieldValue;
    if ((cVar1 == '\0') || (cVar1 == '\x06')) {
      local_358._0_8_ = &PTR__STVector256_002d3328;
      aStack_348._M_allocated_capacity = 0;
      aStack_348._8_8_ = (base_uint<256UL,_void> *)0x0;
      aStack_338._M_allocated_capacity = 0;
      local_358._8_8_ = name_00;
      UVar10 = Json::Value::size((Value *)name);
      if (UVar10 != 0) {
        UVar10 = 0;
        do {
          local_2e8._0_8_ = 0;
          local_2e8._8_8_ = 0;
          local_2f8._0_8_ = (pointer)0x0;
          local_2f8._8_8_ = 0;
          pVVar17 = Json::Value::operator[]((Value *)name,UVar10);
          Json::Value::asString_abi_cxx11_((string *)local_3a0,pVVar17);
          base_uint<256UL,_void>::SetHex
                    ((base_uint<256UL,_void> *)local_2f8,
                     (char *)CONCAT44(local_3a0._4_4_,local_3a0._0_4_),false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_3a0._4_4_,local_3a0._0_4_) != &aStack_390) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_3a0._4_4_,local_3a0._0_4_),
                            CONCAT44(aStack_390._M_allocated_capacity._4_4_,
                                     aStack_390._M_allocated_capacity._0_4_) + 1);
          }
          if (aStack_348._8_8_ == aStack_338._M_allocated_capacity) {
            std::vector<jbcoin::base_uint<256ul,void>,std::allocator<jbcoin::base_uint<256ul,void>>>
            ::_M_realloc_insert<jbcoin::base_uint<256ul,void>const&>
                      ((vector<jbcoin::base_uint<256ul,void>,std::allocator<jbcoin::base_uint<256ul,void>>>
                        *)aStack_348._M_local_buf,(iterator)aStack_348._8_8_,
                       (base_uint<256UL,_void> *)local_2f8);
          }
          else {
            *(undefined8 *)(aStack_348._8_8_ + 0x10) = local_2e8._0_8_;
            *(undefined8 *)(aStack_348._8_8_ + 0x18) = local_2e8._8_8_;
            *(undefined8 *)aStack_348._8_8_ = local_2f8._0_8_;
            *(undefined8 *)(aStack_348._8_8_ + 8) = local_2f8._8_8_;
            aStack_348._8_8_ = aStack_348._8_8_ + 0x20;
          }
          UVar10 = UVar10 + 1;
          UVar11 = Json::Value::size((Value *)name);
        } while (UVar10 < UVar11);
      }
      local_2f8._0_8_ = &PTR__STVector256_002d3328;
      local_2f8._8_8_ = local_358._8_8_;
      local_2e8._0_8_ = aStack_348._M_allocated_capacity;
      local_2e8._8_8_ = aStack_348._8_8_;
      local_2e8._16_8_ = aStack_338._M_allocated_capacity;
      aStack_348._M_allocated_capacity = 0;
      aStack_348._8_8_ = (base_uint<256UL,_void> *)0x0;
      aStack_338._M_allocated_capacity = 0;
      local_2a8 = (rval_reference_type)local_2f8;
      boost::optional_detail::optional_base<jbcoin::detail::STVar>::assign
                (&__return_storage_ptr__->super_type,(rval_reference_type)local_2f8);
      if (local_2a8 == (rval_reference_type)local_2f8) {
        puVar18 = *(undefined8 **)&local_2a8->d_;
LAB_001ccb1c:
        poVar20 = (optional<jbcoin::detail::STVar> *)(*(code *)*puVar18)();
      }
      else {
        poVar20 = extraout_RAX_02;
        if (local_2a8 != (rval_reference_type)0x0) {
          puVar18 = (undefined8 *)(*(long *)&local_2a8->d_ + 8);
          goto LAB_001ccb1c;
        }
      }
      local_358._0_8_ = &PTR__STVector256_002d3328;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)aStack_348._M_allocated_capacity ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return poVar20;
      }
      pcVar25 = (char *)(aStack_338._M_allocated_capacity - aStack_348._0_8_);
      uVar16 = aStack_348._M_allocated_capacity;
      goto LAB_001ccbb1;
    }
    array_expected((string *)local_2f8,(string *)(json_name->_M_dataplus)._M_p);
  }
  Json::Value::swap(value,(Value *)local_2f8);
LAB_001ccac2:
  Json::Value::~Value((Value *)local_2f8);
  return extraout_RAX_09;
}

Assistant:

static boost::optional<detail::STVar> parseLeaf (
    std::string const& json_name,
    std::string const& fieldName,
    SField const* name,
    Json::Value const& value,
    Json::Value& error)
{
    boost::optional <detail::STVar> ret;

    auto const& field = SField::getField (fieldName);

    if (field == sfInvalid)
    {
        error = unknown_field (json_name, fieldName);
        return ret;
    }

    switch (field.fieldType)
    {
    case STI_UINT8:
        try
        {
            constexpr auto minValue = std::numeric_limits<std::uint8_t>::min();
            constexpr auto maxValue = std::numeric_limits<std::uint8_t>::max();
            if (value.isString ())
            {
                std::string const strValue = value.asString();

                if (!strValue.empty() &&
                    ((strValue[0] < '0') || (strValue[0] > '9')))
                {
                    if (field == sfTransactionResult)
                    {
                        auto ter = transCode(strValue);

                        if (!ter || *ter < minValue || *ter > maxValue)
                        {
                            error = out_of_range(json_name, fieldName);
                            return ret;
                        }

                        ret = detail::make_stvar<STUInt8>(field,
                            static_cast<std::uint8_t>(*ter));
                    }
                    else
                    {
                        error = bad_type(json_name, fieldName);
                        return ret;
                    }
                }
                else
                {
                    ret = detail::make_stvar <STUInt8>(field,
                        beast::lexicalCastThrow <std::uint8_t>(strValue));
                }
            }
            else if (value.isInt ())
            {
                if (value.asInt () < minValue || value.asInt () > maxValue)
                {
                    error = out_of_range (json_name, fieldName);
                    return ret;
                }

                ret = detail::make_stvar <STUInt8> (field,
                    static_cast <std::uint8_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                if (value.asUInt () > maxValue)
                {
                    error = out_of_range (json_name, fieldName);
                    return ret;
                }

                ret = detail::make_stvar <STUInt8> (field,
                    static_cast <std::uint8_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }
        break;

    case STI_UINT16:
        try
        {
            if (value.isString ())
            {
                std::string const strValue = value.asString ();

                if (! strValue.empty () &&
                    ((strValue[0] < '0') || (strValue[0] > '9')))
                {
                    if (field == sfTransactionType)
                    {
                        TxType const txType (TxFormats::getInstance().
                            findTypeByName (strValue));

                        ret = detail::make_stvar <STUInt16> (field,
                            static_cast <std::uint16_t> (txType));

                        if (*name == sfGeneric)
                            name = &sfTransaction;
                    }
                    else if (field == sfLedgerEntryType)
                    {
                        LedgerEntryType const type (
                            LedgerFormats::getInstance().
                                findTypeByName (strValue));

                        ret = detail::make_stvar <STUInt16> (field,
                            static_cast <std::uint16_t> (type));

                        if (*name == sfGeneric)
                            name = &sfLedgerEntry;
                    }
                    else
                    {
                        error = invalid_data (json_name, fieldName);
                        return ret;
                    }
                }
                else
                {
                    ret = detail::make_stvar <STUInt16> (field,
                        beast::lexicalCastThrow <std::uint16_t> (strValue));
                }
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt16> (field,
                    to_unsigned <std::uint16_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt16> (field,
                    to_unsigned <std::uint16_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_UINT32:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    beast::lexicalCastThrow <std::uint32_t> (
                        value.asString ()));
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    to_unsigned <std::uint32_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt32> (field,
                    static_cast <std::uint32_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_UINT64:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    uintFromHex (value.asString ()));
            }
            else if (value.isInt ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    to_unsigned<std::uint64_t> (value.asInt ()));
            }
            else if (value.isUInt ())
            {
                ret = detail::make_stvar <STUInt64> (field,
                    static_cast <std::uint64_t> (value.asUInt ()));
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH128:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash128> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH160:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash160> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_HASH256:
        try
        {
            if (value.isString ())
            {
                ret = detail::make_stvar <STHash256> (field, value.asString ());
            }
            else
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_VL:
        if (! value.isString ())
        {
            error = bad_type (json_name, fieldName);
            return ret;
        }

        try
        {
            std::pair<Blob, bool> vBlob (strUnHex (value.asString ()));

            if (! vBlob.second)
                Throw<std::invalid_argument> ("invalid data");

            ret = detail::make_stvar <STBlob> (field, vBlob.first.data (),
                                             vBlob.first.size ());
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_AMOUNT:
        try
        {
            ret = detail::make_stvar <STAmount> (amountFromJson (field, value));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_VECTOR256:
        if (! value.isArray ())
        {
            error = array_expected (json_name, fieldName);
            return ret;
        }

        try
        {
            STVector256 tail (field);
            for (Json::UInt i = 0; value.isValidIndex (i); ++i)
            {
                uint256 s;
                s.SetHex (value[i].asString ());
                tail.push_back (s);
            }
            ret = detail::make_stvar <STVector256> (std::move (tail));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_PATHSET:
        if (!value.isArray ())
        {
            error = array_expected (json_name, fieldName);
            return ret;
        }

        try
        {
            STPathSet tail (field);

            for (Json::UInt i = 0; value.isValidIndex (i); ++i)
            {
                STPath p;

                if (!value[i].isArray ())
                {
                    std::stringstream ss;
                    ss << fieldName << "[" << i << "]";
                    error = array_expected (json_name, ss.str ());
                    return ret;
                }

                for (Json::UInt j = 0; value[i].isValidIndex (j); ++j)
                {
                    std::stringstream ss;
                    ss << fieldName << "[" << i << "][" << j << "]";
                    std::string const element_name (
                        json_name + "." + ss.str());

                    // each element in this path has some combination of
                    // account, currency, or issuer

                    Json::Value pathEl = value[i][j];

                    if (!pathEl.isObject ())
                    {
                        error = not_an_object (element_name);
                        return ret;
                    }

                    Json::Value const& account  = pathEl["account"];
                    Json::Value const& currency = pathEl["currency"];
                    Json::Value const& issuer   = pathEl["issuer"];
                    bool hasCurrency            = false;
                    AccountID uAccount, uIssuer;
                    Currency uCurrency;

                    if (account)
                    {
                        // human account id
                        if (! account.isString ())
                        {
                            error = string_expected (element_name, "account");
                            return ret;
                        }

                        // If we have what looks like a 160-bit hex value, we
                        // set it, otherwise, we assume it's an AccountID
                        if (!uAccount.SetHexExact (account.asString ()))
                        {
                            auto const a = parseBase58<AccountID>(
                                account.asString());
                            if (! a)
                            {
                                error = invalid_data (element_name, "account");
                                return ret;
                            }
                            uAccount = *a;
                        }
                    }

                    if (currency)
                    {
                        // human currency
                        if (!currency.isString ())
                        {
                            error = string_expected (element_name, "currency");
                            return ret;
                        }

                        hasCurrency = true;

                        if (!uCurrency.SetHexExact (currency.asString ()))
                        {
                            if (!to_currency (uCurrency, currency.asString ()))
                            {
                                error = invalid_data (element_name, "currency");
                                return ret;
                            }
                        }
                    }

                    if (issuer)
                    {
                        // human account id
                        if (!issuer.isString ())
                        {
                            error = string_expected (element_name, "issuer");
                            return ret;
                        }

                        if (!uIssuer.SetHexExact (issuer.asString ()))
                        {
                            auto const a = parseBase58<AccountID>(
                                issuer.asString());
                            if (! a)
                            {
                                error = invalid_data (element_name, "issuer");
                                return ret;
                            }
                            uIssuer = *a;
                        }
                    }

                    p.emplace_back (uAccount, uCurrency, uIssuer, hasCurrency);
                }

                tail.push_back (p);
            }
            ret = detail::make_stvar <STPathSet> (std::move (tail));
        }
        catch (std::exception const&)
        {
            error = invalid_data (json_name, fieldName);
            return ret;
        }

        break;

    case STI_ACCOUNT:
        {
            if (! value.isString ())
            {
                error = bad_type (json_name, fieldName);
                return ret;
            }

            std::string const strValue = value.asString ();

            try
            {
                // VFALCO This needs careful auditing
                auto const account =
                    parseHexOrBase58<AccountID>(
                        strValue);
                if (! account)
                {
                    error = invalid_data (json_name, fieldName);
                    return ret;
                }
                ret = detail::make_stvar <STAccount>(
                    field, *account);
            }
            catch (std::exception const&)
            {
                error = invalid_data (json_name, fieldName);
                return ret;
            }
        }
        break;

    default:
        error = bad_type (json_name, fieldName);
        return ret;
    }

    return ret;
}